

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URResolution.cpp
# Opt level: O0

Clause * __thiscall Inferences::URResolution::Item::generateClause(Item *this)

{
  SingletonIterator<Kernel::Literal_*> it_00;
  bool bVar1;
  size_t sVar2;
  Literal **ppLVar3;
  Clause **ppCVar4;
  long in_RDI;
  SingletonIterator<Kernel::Literal_*> SVar5;
  LiteralIterator it;
  Clause *res;
  Inference inf;
  Clause *premise;
  uint i;
  uint clen;
  Literal *single;
  UnitList *premLst;
  List<Kernel::Unit_*> **in_stack_fffffffffffffed8;
  Clause *pCVar6;
  Clause *in_stack_fffffffffffffee0;
  undefined7 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffeff;
  Inference *in_stack_ffffffffffffff00;
  Literal *in_stack_ffffffffffffff10;
  undefined7 in_stack_ffffffffffffff18;
  VirtualIterator<Kernel::Literal_*> local_d8;
  VirtualIterator<Kernel::Literal_*> local_d0;
  undefined1 in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff39;
  VirtualIterator<Kernel::Literal_*> *in_stack_ffffffffffffff40;
  VirtualIterator<Kernel::Literal_*> *in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  Inference *in_stack_ffffffffffffff58;
  IterTraits<Lib::CatIterator<Lib::SingletonIterator<Kernel::Literal_*>,_Lib::IterTraits<Lib::VirtualIterator<Kernel::Literal_*>_>_>_>
  *in_stack_ffffffffffffff60;
  VirtualIterator<Kernel::Literal_*> local_78;
  Clause *local_70;
  GeneratingInferenceMany local_68;
  Inference local_58;
  Clause *local_28;
  uint local_20;
  uint local_1c;
  Literal *local_18;
  UnitList *local_10;
  
  local_10 = (UnitList *)0x0;
  Lib::List<Kernel::Unit_*>::push(&in_stack_fffffffffffffee0->super_Unit,in_stack_fffffffffffffed8);
  local_18 = (Literal *)0x0;
  sVar2 = Lib::Stack<Kernel::Literal_*>::size((Stack<Kernel::Literal_*> *)(in_RDI + 0x30));
  local_1c = (uint)sVar2;
  for (local_20 = 0; local_20 < local_1c; local_20 = local_20 + 1) {
    ppLVar3 = Lib::Stack<Kernel::Literal_*>::operator[]
                        ((Stack<Kernel::Literal_*> *)(in_RDI + 0x30),(ulong)local_20);
    if (*ppLVar3 == (Literal *)0x0) {
      ppCVar4 = Lib::DArray<Kernel::Clause_*>::operator[]
                          ((DArray<Kernel::Clause_*> *)(in_RDI + 0x18),(ulong)local_20);
      local_28 = *ppCVar4;
      Lib::List<Kernel::Unit_*>::push
                (&in_stack_fffffffffffffee0->super_Unit,in_stack_fffffffffffffed8);
    }
    else {
      ppLVar3 = Lib::Stack<Kernel::Literal_*>::operator[]
                          ((Stack<Kernel::Literal_*> *)(in_RDI + 0x30),(ulong)local_20);
      local_18 = *ppLVar3;
    }
  }
  Kernel::GeneratingInferenceMany::GeneratingInferenceMany
            (&local_68,UNIT_RESULTING_RESOLUTION,local_10);
  Kernel::Inference::Inference
            (in_stack_ffffffffffffff00,
             (GeneratingInferenceMany *)
             CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
  if (*(long *)(in_RDI + 0x50) == 0) {
    Lib::VirtualIterator<Kernel::Literal_*>::getEmpty();
  }
  else {
    SVar5 = Lib::getSingletonIterator<Kernel::Literal*>((Literal *)0x83ea32);
    in_stack_ffffffffffffff10 = SVar5._el;
    it_00._el._0_7_ = in_stack_ffffffffffffff18;
    it_00._0_8_ = in_stack_ffffffffffffff10;
    it_00._el._7_1_ = SVar5._finished;
    Lib::pvi<Lib::SingletonIterator<Kernel::Literal*>>(it_00);
  }
  if (local_18 == (Literal *)0x0) {
    Lib::VirtualIterator<Kernel::Literal_*>::VirtualIterator(&local_d8,&local_78);
    in_stack_fffffffffffffee0 =
         Kernel::Clause::fromIterator<Lib::VirtualIterator<Kernel::Literal*>>
                   (in_stack_ffffffffffffff40,
                    (Inference *)CONCAT71(in_stack_ffffffffffffff39,in_stack_ffffffffffffff38));
    local_70 = in_stack_fffffffffffffee0;
    Lib::VirtualIterator<Kernel::Literal_*>::~VirtualIterator
              ((VirtualIterator<Kernel::Literal_*> *)in_stack_fffffffffffffee0);
  }
  else {
    if ((*(long *)(in_RDI + 0x50) == 0) || (bVar1 = Kernel::Term::ground((Term *)0x83eaaf), bVar1))
    {
      local_18 = Kernel::Renaming::normalize(in_stack_ffffffffffffff10);
    }
    Lib::getSingletonIterator<Kernel::Literal*>((Literal *)0x83eb21);
    Lib::VirtualIterator<Kernel::Literal_*>::VirtualIterator(&local_d0,&local_78);
    SVar5._el = (Literal *)in_stack_ffffffffffffff58;
    SVar5._0_8_ = in_stack_ffffffffffffff50;
    Lib::
    concatIters<Lib::SingletonIterator<Kernel::Literal*>,Lib::VirtualIterator<Kernel::Literal*>>
              (SVar5,in_stack_ffffffffffffff48);
    local_70 = Kernel::Clause::
               fromIterator<Lib::IterTraits<Lib::CatIterator<Lib::SingletonIterator<Kernel::Literal*>,Lib::IterTraits<Lib::VirtualIterator<Kernel::Literal*>>>>>
                         (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    Lib::
    IterTraits<Lib::CatIterator<Lib::SingletonIterator<Kernel::Literal_*>,_Lib::IterTraits<Lib::VirtualIterator<Kernel::Literal_*>_>_>_>
    ::~IterTraits((IterTraits<Lib::CatIterator<Lib::SingletonIterator<Kernel::Literal_*>,_Lib::IterTraits<Lib::VirtualIterator<Kernel::Literal_*>_>_>_>
                   *)0x83eb9c);
    Lib::VirtualIterator<Kernel::Literal_*>::~VirtualIterator
              ((VirtualIterator<Kernel::Literal_*> *)in_stack_fffffffffffffee0);
  }
  pCVar6 = local_70;
  Lib::VirtualIterator<Kernel::Literal_*>::~VirtualIterator
            ((VirtualIterator<Kernel::Literal_*> *)in_stack_fffffffffffffee0);
  Kernel::Inference::~Inference(&local_58);
  return pCVar6;
}

Assistant:

Clause* generateClause() const
  {
    UnitList* premLst = 0;
    UnitList::push(_orig, premLst);
    Literal* single = 0;
    unsigned clen = _lits.size();
    for(unsigned i=0; i<clen; i++) {
      if(_lits[i]!=0) {
        ASS_EQ(single,0);
        ASS_EQ(_premises[i],0);
        single = _lits[i];
      }
      else {
        Clause* premise = _premises[i];
        ASS(premise);
        UnitList::push(premise, premLst);
      }
    }

    Inference inf(GeneratingInferenceMany(InferenceRule::UNIT_RESULTING_RESOLUTION, premLst));
    Clause* res;

    LiteralIterator it = _ansLit ? pvi(getSingletonIterator(_ansLit)) : LiteralIterator::getEmpty();
    if(single) {
      if (!_ansLit || _ansLit->ground()) {
        single = Renaming::normalize(single);
      }
      res = Clause::fromIterator(concatIters(getSingletonIterator(single), it), inf);
    }
    else {
      res = Clause::fromIterator(it, inf);
    }
    return res;
  }